

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::
Apply<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doPrintExpr(Apply<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *this,ostream *os)

{
  BaseArgExprs args;
  ExprBase *local_30;
  _Vector_base<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
  local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = &((this->m_args).a.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
               super_ExprPBase<tcu::Vector<float,_4>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_ptr)->
              super_ExprBase;
  std::
  vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
  ::emplace_back<vkt::shaderexecutor::ExprBase_const*>
            ((vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).b.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
               super_ExprPBase<vkt::shaderexecutor::Void>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr)->
              super_ExprBase;
  std::
  vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
  ::emplace_back<vkt::shaderexecutor::ExprBase_const*>
            ((vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
               super_ExprPBase<vkt::shaderexecutor::Void>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr)->
              super_ExprBase;
  std::
  vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
  ::emplace_back<vkt::shaderexecutor::ExprBase_const*>
            ((vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
               super_ExprPBase<vkt::shaderexecutor::Void>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr)->
              super_ExprBase;
  std::
  vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
  ::emplace_back<vkt::shaderexecutor::ExprBase_const*>
            ((vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
              *)&local_28,&local_30);
  (*(this->m_func->super_FuncBase)._vptr_FuncBase[4])(this->m_func,os,&local_28);
  std::
  _Vector_base<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
  ::~_Vector_base(&local_28);
  return;
}

Assistant:

void				doPrintExpr			(ostream& os) const
	{
		BaseArgExprs	args;
		args.push_back(m_args.a.get());
		args.push_back(m_args.b.get());
		args.push_back(m_args.c.get());
		args.push_back(m_args.d.get());
		m_func.print(os, args);
	}